

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O2

void __thiscall wallet::CMerkleTx::Unserialize<DataStream>(CMerkleTx *this,DataStream *s)

{
  long in_FS_OFFSET;
  vector<uint256,_std::allocator<uint256>_> vMerkleBranch;
  CTransactionRef tx;
  uint256 hashBlock;
  ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_> local_78;
  _Vector_base<uint256,_std::allocator<uint256>_> local_68;
  shared_ptr<const_CTransaction> local_48;
  base_blob<256U> local_38;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.m_object = &local_48;
  local_48.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38.m_data._M_elems[0x10] = '\0';
  local_38.m_data._M_elems[0x11] = '\0';
  local_38.m_data._M_elems[0x12] = '\0';
  local_38.m_data._M_elems[0x13] = '\0';
  local_38.m_data._M_elems[0x14] = '\0';
  local_38.m_data._M_elems[0x15] = '\0';
  local_38.m_data._M_elems[0x16] = '\0';
  local_38.m_data._M_elems[0x17] = '\0';
  local_38.m_data._M_elems[0x18] = '\0';
  local_38.m_data._M_elems[0x19] = '\0';
  local_38.m_data._M_elems[0x1a] = '\0';
  local_38.m_data._M_elems[0x1b] = '\0';
  local_38.m_data._M_elems[0x1c] = '\0';
  local_38.m_data._M_elems[0x1d] = '\0';
  local_38.m_data._M_elems[0x1e] = '\0';
  local_38.m_data._M_elems[0x1f] = '\0';
  local_38.m_data._M_elems[0] = '\0';
  local_38.m_data._M_elems[1] = '\0';
  local_38.m_data._M_elems[2] = '\0';
  local_38.m_data._M_elems[3] = '\0';
  local_38.m_data._M_elems[4] = '\0';
  local_38.m_data._M_elems[5] = '\0';
  local_38.m_data._M_elems[6] = '\0';
  local_38.m_data._M_elems[7] = '\0';
  local_38.m_data._M_elems[8] = '\0';
  local_38.m_data._M_elems[9] = '\0';
  local_38.m_data._M_elems[10] = '\0';
  local_38.m_data._M_elems[0xb] = '\0';
  local_38.m_data._M_elems[0xc] = '\0';
  local_38.m_data._M_elems[0xd] = '\0';
  local_38.m_data._M_elems[0xe] = '\0';
  local_38.m_data._M_elems[0xf] = '\0';
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.m_params = &TX_WITH_WITNESS;
  ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_>::Unserialize<DataStream>
            (&local_78,s);
  base_blob<256U>::Unserialize<DataStream>(&local_38,s);
  Unserialize<DataStream,uint256,std::allocator<uint256>>
            (s,(vector<uint256,_std::allocator<uint256>_> *)&local_68);
  ser_readdata32<DataStream>(s);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base(&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        CTransactionRef tx;
        uint256 hashBlock;
        std::vector<uint256> vMerkleBranch;
        int nIndex;

        s >> TX_WITH_WITNESS(tx) >> hashBlock >> vMerkleBranch >> nIndex;
    }